

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::DiscardData(FlowBuffer *this)

{
  long in_RDI;
  FlowBuffer *in_stack_00000020;
  
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(undefined1 *)(in_RDI + 0x51) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  ContractBuffer(in_stack_00000020);
  return;
}

Assistant:

void FlowBuffer::DiscardData()
	{
	mode_ = UNKNOWN_MODE;
	message_complete_ = false;
	have_pending_request_ = false;
	orig_data_begin_ = orig_data_end_ = nullptr;

	buffer_n_ = 0;
	frame_length_ = 0;
	ContractBuffer();
	}